

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O2

void __thiscall
gimage::Histogram::Histogram<unsigned_char>
          (Histogram *this,Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,
          int binsize)

{
  uchar ***pppuVar1;
  unsigned_long *puVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int d;
  ulong uVar7;
  
  this->bs = 0;
  this->w = 0;
  this->h = 0;
  this->val = (unsigned_long *)0x0;
  this->row = (unsigned_long **)0x0;
  iVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::maxValue(image);
  if (0xffff < iVar4) {
    iVar4 = 0x10000;
  }
  if (iVar4 < 0x101) {
    iVar4 = 0x100;
  }
  setSize(this,iVar4 / binsize,1,binsize);
  clear(this);
  for (lVar5 = 0; lVar5 < image->height; lVar5 = lVar5 + 1) {
    uVar3 = image->depth;
    if (image->depth < 1) {
      uVar3 = 0;
    }
    for (lVar6 = 0; lVar6 < image->width; lVar6 = lVar6 + 1) {
      pppuVar1 = image->img;
      iVar4 = this->w;
      puVar2 = this->val;
      for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
        if ((int)(uint)pppuVar1[uVar7][lVar5][lVar6] < (iVar4 + 1) * binsize + -1) {
          puVar2[(int)((long)(ulong)pppuVar1[uVar7][lVar5][lVar6] / (long)binsize)] =
               puVar2[(int)((long)(ulong)pppuVar1[uVar7][lVar5][lVar6] / (long)binsize)] + 1;
        }
      }
    }
  }
  return;
}

Assistant:

Histogram(const Image<T> &image, int binsize=1)
    {
      w=h=bs=0;
      val=0;
      row=0;

      int width=std::max(256, std::min(65536, static_cast<int>(image.maxValue())))/binsize;
      setSize(width, 1, binsize);
      clear();

      for (int k=0; k<image.getHeight(); k++)
      {
        for (int i=0; i<image.getWidth(); i++)
        {
          if (image.isValid(i, k))
          {
            for (int d=0; d<image.getDepth(); d++)
            {
              T v=image.get(i, k, d);

              if (v < w*binsize+binsize-1)
              {
                val[static_cast<int>(v)/binsize]++;
              }
            }
          }
        }
      }
    }